

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeFragments
          (VertexVaryingShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int i;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  FragmentPacket *pFVar6;
  int fragNdx;
  int iVar7;
  float local_88;
  deUint32 dStack_84;
  undefined8 uStack_80;
  FragmentPacket *local_78;
  undefined4 local_70;
  float local_6c;
  undefined4 local_68;
  undefined4 local_64;
  float local_60 [4];
  ulong local_50;
  VertexVaryingShader *local_48;
  rr local_40 [16];
  
  if (0 < numPackets) {
    local_50 = (ulong)(uint)numPackets;
    iVar4 = 0;
    uVar5 = 0;
    local_78 = packets;
    local_48 = this;
    do {
      iVar7 = local_48->m_geometryOut;
      if (iVar7 == 0) {
        pGVar1 = context->outputArray;
        iVar7 = context->numFragmentOutputs;
        iVar3 = iVar7 * iVar4;
        lVar2 = 4;
        do {
          *(undefined8 *)&pGVar1[iVar3].v = 0x3f800000;
          *(undefined8 *)((long)&pGVar1[iVar3].v + 8) = 0x3f80000000000000;
          iVar3 = iVar3 + iVar7;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
      else if (iVar7 == 1) {
        pFVar6 = local_78 + uVar5;
        iVar7 = 0;
        do {
          rr::readTriangleVarying<float>((rr *)&local_88,pFVar6,context,0,iVar7);
          pGVar1 = context->outputArray;
          iVar3 = (iVar4 + iVar7) * context->numFragmentOutputs;
          pGVar1[iVar3].v.uData[0] = (deUint32)local_88;
          pGVar1[iVar3].v.uData[1] = dStack_84;
          pGVar1[iVar3].v.uData[2] = (deUint32)uStack_80;
          pGVar1[iVar3].v.uData[3] = uStack_80._4_4_;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 4);
      }
      else if (iVar7 == 2) {
        pFVar6 = local_78 + uVar5;
        iVar7 = 0;
        do {
          rr::readTriangleVarying<float>(local_40,pFVar6,context,0,iVar7);
          rr::readTriangleVarying<float>((rr *)&local_70,pFVar6,context,1,iVar7);
          local_60[0] = local_6c;
          local_60[1] = (float)local_70;
          local_60[2] = (float)local_68;
          local_60[3] = (float)local_64;
          _local_88 = 0;
          uStack_80 = 0;
          lVar2 = 0;
          do {
            (&local_88)[lVar2] = *(float *)(local_40 + lVar2 * 4) + local_60[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          pGVar1 = context->outputArray;
          iVar3 = (iVar7 + (int)uVar5 * 4) * context->numFragmentOutputs;
          pGVar1[iVar3].v.uData[0] = (deUint32)local_88;
          pGVar1[iVar3].v.uData[1] = dStack_84;
          pGVar1[iVar3].v.uData[2] = (deUint32)uStack_80;
          pGVar1[iVar3].v.uData[3] = uStack_80._4_4_;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 4);
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + 4;
    } while (uVar5 != local_50);
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		switch (m_geometryOut)
		{
			case 0:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
				break;

			case 1:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx));
				break;

			case 2:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0,   rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx)
					                                                        + rr::readTriangleVarying<float>(packets[packetNdx], context, 1, fragNdx).swizzle(1, 0, 2, 3));
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}